

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::IndexPropertyDescriptorMap::IndexPropertyDescriptorMap
          (IndexPropertyDescriptorMap *this,Recycler *recycler,
          IndexPropertyDescriptorMap *indexPropertyDescriptorMap)

{
  uint32 *ptr;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *ptr_00;
  
  this->recycler = recycler;
  (this->indexPropertyMap).ptr =
       (BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->indexList).ptr = (uint *)0x0;
  this->lastIndexAt = indexPropertyDescriptorMap->lastIndexAt;
  ptr = CopyIndexList(indexPropertyDescriptorMap);
  Memory::WriteBarrierPtr<unsigned_int>::WriteBarrierSet(&this->indexList,ptr);
  ptr_00 = JsUtil::
           BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::Clone((indexPropertyDescriptorMap->indexPropertyMap).ptr);
  Memory::
  WriteBarrierPtr<JsUtil::BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::WriteBarrierSet(&this->indexPropertyMap,ptr_00);
  return;
}

Assistant:

IndexPropertyDescriptorMap::IndexPropertyDescriptorMap(Recycler* recycler, const IndexPropertyDescriptorMap * const indexPropertyDescriptorMap)
        : recycler(recycler), lastIndexAt(indexPropertyDescriptorMap->lastIndexAt)
    {
        indexList = indexPropertyDescriptorMap->CopyIndexList();
        indexPropertyMap = indexPropertyDescriptorMap->indexPropertyMap->Clone();
    }